

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall cmCommandArgumentParserHelper::Error(cmCommandArgumentParserHelper *this,char *str)

{
  ostream *poVar1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream ostr;
  size_type sStack_20;
  bool isEof;
  size_type pos;
  char *str_local;
  cmCommandArgumentParserHelper *this_local;
  
  sStack_20 = this->InputBufferPos;
  if (this->InputBufferPos <= this->InputSize) {
    sStack_20 = sStack_20 - this->LastTokenLength;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,str);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sStack_20);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  SetError(this,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::Error(const char* str)
{
  auto pos = this->InputBufferPos;
  auto const isEof = (this->InputSize < this->InputBufferPos);
  if (!isEof) {
    pos -= this->LastTokenLength;
  }

  std::ostringstream ostr;
  ostr << str << " (" << pos << ")";
  this->SetError(ostr.str());
}